

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

string * google::protobuf::strings::CHexEscape(string *__return_storage_ptr__,string *src)

{
  int src_len;
  int iVar1;
  char *dest;
  LogMessage *other;
  LogFinisher local_69;
  LogMessage local_68;
  
  src_len = (int)src->_M_string_length;
  iVar1 = src_len * 4 + 1;
  dest = (char *)operator_new__((long)iVar1);
  iVar1 = CEscapeInternal((src->_M_dataplus)._M_p,src_len,dest,iVar1,true,false);
  if (iVar1 < 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/stubs/strutil.cc"
               ,0x226);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: (len) >= (0): ");
    internal::LogFinisher::operator=(&local_69,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,dest,dest + iVar1);
  operator_delete__(dest);
  return __return_storage_ptr__;
}

Assistant:

string CHexEscape(const string& src) {
  const int dest_length = src.size() * 4 + 1; // Maximum possible expansion
  scoped_array<char> dest(new char[dest_length]);
  const int len = CEscapeInternal(src.data(), src.size(),
                                  dest.get(), dest_length, true, false);
  GOOGLE_DCHECK_GE(len, 0);
  return string(dest.get(), len);
}